

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::setMultiplier(DecimalFormat *this,int32_t multiplier)

{
  DecimalFormatProperties *pDVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  iVar5 = multiplier + (uint)(multiplier == 0);
  uVar2 = 0;
  iVar4 = iVar5;
  do {
    if (iVar4 == 1) goto LAB_0024f755;
    uVar2 = uVar2 + 1;
    bVar6 = (iVar4 / 10) * 10 == iVar4;
    iVar4 = iVar4 / 10;
  } while (bVar6);
  uVar2 = 0xffffffff;
LAB_0024f755:
  uVar3 = 0;
  if (uVar2 != 0xffffffff) {
    uVar3 = uVar2;
  }
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  iVar4 = 1;
  if (uVar2 == 0xffffffff) {
    iVar4 = iVar5;
  }
  pDVar1->magnitudeMultiplier = uVar3;
  pDVar1->multiplier = iVar4;
  uStack_8 = (ulong)uVar2;
  touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void DecimalFormat::setMultiplier(int32_t multiplier) {
    if (multiplier == 0) {
        multiplier = 1;     // one being the benign default value for a multiplier.
    }

    // Try to convert to a magnitude multiplier first
    int delta = 0;
    int value = multiplier;
    while (value != 1) {
        delta++;
        int temp = value / 10;
        if (temp * 10 != value) {
            delta = -1;
            break;
        }
        value = temp;
    }
    if (delta != -1) {
        fields->properties->magnitudeMultiplier = delta;
        fields->properties->multiplier = 1;
    } else {
        fields->properties->magnitudeMultiplier = 0;
        fields->properties->multiplier = multiplier;
    }
    touchNoError();
}